

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_load_store.c
# Opt level: O0

void multiple_load_store(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ushort *in_RSI;
  long in_RDI;
  bool bVar4;
  uint32_t value_1;
  int i_1;
  _Bool first;
  int i;
  access_type_t access;
  _Bool writeback;
  uint32_t base;
  uint32_t address;
  multiple_load_store_t *instr;
  uint32_t value_2;
  uint32_t value;
  undefined8 in_stack_fffffffffffffe78;
  uint32_t new_pc;
  arm7tdmi_t *in_stack_fffffffffffffe80;
  uint local_120;
  uint local_11c;
  uint local_114;
  undefined4 local_110;
  uint local_104;
  uint local_e8;
  uint local_d8;
  uint local_8c;
  uint local_7c;
  uint local_6c;
  uint local_60;
  
  uVar2 = (uint)(*in_RSI >> 8 & 7);
  if ((((*(uint *)(in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
    local_d8 = *(uint *)(in_RDI + 0x6c + (ulong)(uVar2 - 8) * 4);
  }
  else if (uVar2 < 0xd) {
    local_d8 = *(uint *)(in_RDI + 0x38 + (ulong)uVar2 * 4);
  }
  else if (uVar2 == 0xd) {
    switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
    case 0x11:
      local_8c = *(uint *)(in_RDI + 0x84);
      break;
    case 0x12:
      local_8c = *(uint *)(in_RDI + 0x90);
      break;
    case 0x13:
      local_8c = *(uint *)(in_RDI + 0x88);
      break;
    default:
      local_8c = *(uint *)(in_RDI + 0x80);
      break;
    case 0x17:
      local_8c = *(uint *)(in_RDI + 0x8c);
      break;
    case 0x1b:
      local_8c = *(uint *)(in_RDI + 0x94);
    }
    local_d8 = local_8c;
  }
  else if (uVar2 == 0xe) {
    switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
    case 0x11:
      local_6c = *(uint *)(in_RDI + 0x9c);
      break;
    case 0x12:
      local_6c = *(uint *)(in_RDI + 0xa8);
      break;
    case 0x13:
      local_6c = *(uint *)(in_RDI + 0xa0);
      break;
    default:
      local_6c = *(uint *)(in_RDI + 0x98);
      break;
    case 0x17:
      local_6c = *(uint *)(in_RDI + 0xa4);
      break;
    case 0x1b:
      local_6c = *(uint *)(in_RDI + 0xac);
    }
    local_d8 = local_6c;
  }
  else {
    if (uVar2 != 0xf) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
              ,0xa4);
      fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
      exit(1);
    }
    local_d8 = *(uint *)(in_RDI + 0xb0);
  }
  local_104 = local_d8;
  bVar4 = true;
  local_110 = 2;
  new_pc = (uint32_t)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  if ((*in_RSI & 0xff) == 0) {
    if ((*in_RSI >> 0xb & 1) == 0) {
      (**(code **)(in_RDI + 0x28))(local_d8,*(int *)(in_RDI + 0xb0) + 2,2);
    }
    else {
      uVar2 = (**(code **)(in_RDI + 0x10))(local_d8,2);
      if (2 < gba_log_verbosity) {
        printf("[DEBUG] Set r%d to 0x%08X\n",0xf,(ulong)(uVar2 | 1));
      }
      if ((*(uint *)(in_RDI + 0xb4) >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffffe80,new_pc);
      }
      else {
        set_pc(in_stack_fffffffffffffe80,new_pc);
      }
    }
    local_104 = local_d8 + 0x40;
  }
  else if ((*in_RSI >> 0xb & 1) == 0) {
    bVar1 = true;
    for (local_11c = 0; (int)local_11c < 8; local_11c = local_11c + 1) {
      if (((int)(uint)(*in_RSI & 0xff) >> ((byte)local_11c & 0x1f) & 1U) != 0) {
        if (local_11c == (*in_RSI >> 8 & 7)) {
          if (bVar1) {
            local_120 = local_d8;
          }
          else {
            uVar3 = (ulong)(*in_RSI & 0xff) - ((ulong)((*in_RSI & 0xff) >> 1) & 0x5555555555555555);
            uVar3 = (uVar3 & 0x3333333333333333) + (uVar3 >> 2 & 0x3333333333333333);
            local_120 = local_d8 +
                        (int)(((uVar3 + (uVar3 >> 4) & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                              0x38) << 2);
          }
        }
        else {
          if ((((*(uint *)(in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < local_11c)) && (local_11c < 0xd))
          {
            local_e8 = *(uint *)(in_RDI + 0x6c + (ulong)(local_11c - 8) * 4);
          }
          else if (local_11c < 0xd) {
            local_e8 = *(uint *)(in_RDI + 0x38 + (ulong)local_11c * 4);
          }
          else if (local_11c == 0xd) {
            switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
            case 0x11:
              local_7c = *(uint *)(in_RDI + 0x84);
              break;
            case 0x12:
              local_7c = *(uint *)(in_RDI + 0x90);
              break;
            case 0x13:
              local_7c = *(uint *)(in_RDI + 0x88);
              break;
            default:
              local_7c = *(uint *)(in_RDI + 0x80);
              break;
            case 0x17:
              local_7c = *(uint *)(in_RDI + 0x8c);
              break;
            case 0x1b:
              local_7c = *(uint *)(in_RDI + 0x94);
            }
            local_e8 = local_7c;
          }
          else if (local_11c == 0xe) {
            switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
            case 0x11:
              local_60 = *(uint *)(in_RDI + 0x9c);
              break;
            case 0x12:
              local_60 = *(uint *)(in_RDI + 0xa8);
              break;
            case 0x13:
              local_60 = *(uint *)(in_RDI + 0xa0);
              break;
            default:
              local_60 = *(uint *)(in_RDI + 0x98);
              break;
            case 0x17:
              local_60 = *(uint *)(in_RDI + 0xa4);
              break;
            case 0x1b:
              local_60 = *(uint *)(in_RDI + 0xac);
            }
            local_e8 = local_60;
          }
          else {
            if (local_11c != 0xf) {
              fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                      "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                      ,0xa4);
              fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)local_11c);
              exit(1);
            }
            local_e8 = *(uint *)(in_RDI + 0xb0);
          }
          local_120 = local_e8;
        }
        (**(code **)(in_RDI + 0x28))(local_104,local_120,local_110);
        local_110 = 1;
        bVar1 = false;
        local_104 = local_104 + 4;
      }
    }
  }
  else {
    bVar4 = ((uint)(*in_RSI & 0xff) & 1 << ((byte)(*in_RSI >> 8) & 7)) == 0;
    for (local_114 = 0; (int)local_114 < 9; local_114 = local_114 + 1) {
      if (((int)(uint)(*in_RSI & 0xff) >> ((byte)local_114 & 0x1f) & 1U) != 0) {
        uVar2 = (**(code **)(in_RDI + 0x10))(local_104,local_110);
        if (2 < gba_log_verbosity) {
          printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)local_114,(ulong)uVar2);
        }
        if ((((*(uint *)(in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < local_114)) && (local_114 < 0xd)) {
          *(uint *)(in_RDI + 0x6c + (ulong)(local_114 - 8) * 4) = uVar2;
        }
        else if (local_114 < 0xd) {
          *(uint *)(in_RDI + 0x38 + (ulong)local_114 * 4) = uVar2;
        }
        else if (local_114 == 0xd) {
          switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
          case 0x11:
            *(uint *)(in_RDI + 0x84) = uVar2;
            break;
          case 0x12:
            *(uint *)(in_RDI + 0x90) = uVar2;
            break;
          case 0x13:
            *(uint *)(in_RDI + 0x88) = uVar2;
            break;
          default:
            *(uint *)(in_RDI + 0x80) = uVar2;
            break;
          case 0x17:
            *(uint *)(in_RDI + 0x8c) = uVar2;
            break;
          case 0x1b:
            *(uint *)(in_RDI + 0x94) = uVar2;
          }
        }
        else if (local_114 == 0xe) {
          switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
          case 0x11:
            *(uint *)(in_RDI + 0x9c) = uVar2;
            break;
          case 0x12:
            *(uint *)(in_RDI + 0xa8) = uVar2;
            break;
          case 0x13:
            *(uint *)(in_RDI + 0xa0) = uVar2;
            break;
          default:
            *(uint *)(in_RDI + 0x98) = uVar2;
            break;
          case 0x17:
            *(uint *)(in_RDI + 0xa4) = uVar2;
            break;
          case 0x1b:
            *(uint *)(in_RDI + 0xac) = uVar2;
          }
        }
        else {
          if (local_114 != 0xf) {
            fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                    "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                    ,0xeb);
            fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)local_114);
            exit(1);
          }
          if ((*(uint *)(in_RDI + 0xb4) >> 5 & 1) == 0) {
            set_pc(in_stack_fffffffffffffe80,new_pc);
          }
          else {
            set_pc(in_stack_fffffffffffffe80,new_pc);
          }
        }
        local_110 = 1;
        local_104 = local_104 + 4;
      }
    }
  }
  if (bVar4) {
    uVar2 = (uint)(*in_RSI >> 8 & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar2,(ulong)local_104);
    }
    if ((((*(uint *)(in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
      *(uint *)(in_RDI + 0x6c + (ulong)(uVar2 - 8) * 4) = local_104;
    }
    else if (uVar2 < 0xd) {
      *(uint *)(in_RDI + 0x38 + (ulong)uVar2 * 4) = local_104;
    }
    else if (uVar2 == 0xd) {
      switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        *(uint *)(in_RDI + 0x84) = local_104;
        break;
      case 0x12:
        *(uint *)(in_RDI + 0x90) = local_104;
        break;
      case 0x13:
        *(uint *)(in_RDI + 0x88) = local_104;
        break;
      default:
        *(uint *)(in_RDI + 0x80) = local_104;
        break;
      case 0x17:
        *(uint *)(in_RDI + 0x8c) = local_104;
        break;
      case 0x1b:
        *(uint *)(in_RDI + 0x94) = local_104;
      }
    }
    else if (uVar2 == 0xe) {
      switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        *(uint *)(in_RDI + 0x9c) = local_104;
        break;
      case 0x12:
        *(uint *)(in_RDI + 0xa8) = local_104;
        break;
      case 0x13:
        *(uint *)(in_RDI + 0xa0) = local_104;
        break;
      default:
        *(uint *)(in_RDI + 0x98) = local_104;
        break;
      case 0x17:
        *(uint *)(in_RDI + 0xa4) = local_104;
        break;
      case 0x1b:
        *(uint *)(in_RDI + 0xac) = local_104;
      }
    }
    else {
      if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
      if ((*(uint *)(in_RDI + 0xb4) >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffffe80,new_pc);
      }
      else {
        set_pc(in_stack_fffffffffffffe80,new_pc);
      }
    }
  }
  return;
}

Assistant:

void multiple_load_store(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    multiple_load_store_t* instr = &thminstr->MULTIPLE_LOAD_STORE;
    word address = get_register(state, instr->rb);
    word base = address;
    bool writeback = true;
    access_type_t access = ACCESS_NONSEQUENTIAL;
    if (instr->rlist == 0) { // When rlist 0, save and load the program counter instead
        if (instr->l) {
            set_register(state, REG_PC, state->read_word(address, ACCESS_NONSEQUENTIAL) | 1);
        } else {
            state->write_word(address, state->pc + 2, ACCESS_NONSEQUENTIAL);
        }
        address += 0x40;
    }
    else if (instr->l) {
        if (instr->rlist & (1 << instr->rb)) {
            writeback = false; // Don't writeback to rb when we're also transferring to rb
        }
        for (int i = 0; i <= 8; i++) {
            if ((instr->rlist >> i) & 1) {
                set_register(state, i, state->read_word(address, access));
                access = ACCESS_SEQUENTIAL;
                address += 4;
            }
        }
    } else {
        bool first = true;
        for (int i = 0; i < 8; i++) {
            if ((instr->rlist >> i) & 1) {
                word value;
                if (i == instr->rb) {
                    if (first) {
                        value = base;
                    } else {
                        value = base + 4 * popcount(instr->rlist);
                    }
                } else {
                    value = get_register(state, i);
                }

                state->write_word(address, value, access);
                access = ACCESS_SEQUENTIAL;
                first = false;
                address += 4;
            }
        }
    }

    if (writeback) {
        set_register(state, instr->rb, address);
    }
}